

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.h
# Opt level: O0

void __thiscall fmp4_stream::emsg::zero_set(emsg *this)

{
  initializer_list<char> local_30;
  initializer_list<char> local_20;
  emsg *local_10;
  emsg *this_local;
  
  local_10 = this;
  std::initializer_list<char>::initializer_list(&local_20);
  std::__cxx11::string::operator=((string *)&this->scheme_id_uri_,local_20._M_array,local_20._M_len)
  ;
  std::initializer_list<char>::initializer_list(&local_30);
  std::__cxx11::string::operator=((string *)&this->value_,local_30._M_array,local_30._M_len);
  this->timescale_ = 0;
  this->presentation_time_delta_ = 0;
  this->presentation_time_ = 0;
  this->event_duration_ = 0;
  this->id_ = 0;
  return;
}

Assistant:

void zero_set()
		{
			scheme_id_uri_ = {};
			value_ = {};
			timescale_=0;
			presentation_time_delta_=0;
			presentation_time_=0;
			event_duration_=0;
			id_=0;
		}